

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

void __thiscall ON_2dPoint::Transform(ON_2dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_30;
  double ww;
  double yy;
  double xx;
  ON_Xform *xform_local;
  ON_2dPoint *this_local;
  
  local_30 = xform->m_xform[3][0] * this->x + xform->m_xform[3][1] * this->y + xform->m_xform[3][3];
  if ((local_30 != 0.0) || (NAN(local_30))) {
    local_30 = 1.0 / local_30;
  }
  dVar1 = xform->m_xform[1][0];
  dVar2 = this->x;
  dVar3 = xform->m_xform[1][1];
  dVar4 = xform->m_xform[1][3];
  this->x = local_30 *
            (xform->m_xform[0][0] * this->x + xform->m_xform[0][1] * this->y + xform->m_xform[0][3])
  ;
  this->y = local_30 * (dVar1 * dVar2 + dVar3 * this->y + dVar4);
  return;
}

Assistant:

void ON_2dPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,ww;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][3];
  if ( ww != 0.0 )
    ww = 1.0/ww;
  xx = ww*(xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][3]);
  yy = ww*(xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][3]);
  x = xx;
  y = yy;
}